

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

htab_hash_t macro_hash(macro_t macro,void *arg)

{
  char *key;
  size_t len;
  uint64_t uVar1;
  void *arg_local;
  macro_t macro_local;
  
  key = macro->id->repr;
  len = strlen(macro->id->repr);
  uVar1 = mir_hash(key,len,0x42);
  return (htab_hash_t)uVar1;
}

Assistant:

static htab_hash_t macro_hash (macro_t macro, void *arg MIR_UNUSED) {
  return (htab_hash_t) mir_hash (macro->id->repr, strlen (macro->id->repr), 0x42);
}